

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlatformUtility.cpp
# Opt level: O0

int llbuild::basic::sys::raiseOpenFileLimit(llbuild_rlim_t limit)

{
  unsigned_long *puVar1;
  undefined1 local_30 [8];
  rlimit rl;
  llbuild_rlim_t lStack_18;
  int ret;
  llbuild_rlim_t limit_local;
  
  rl.rlim_max._4_4_ = 0;
  lStack_18 = limit;
  rl.rlim_max._4_4_ = getrlimit(RLIMIT_NOFILE,(rlimit *)local_30);
  limit_local._4_4_ = rl.rlim_max._4_4_;
  if (rl.rlim_max._4_4_ == 0) {
    if ((ulong)local_30 < lStack_18) {
      puVar1 = std::min<unsigned_long>(&stack0xffffffffffffffe8,&rl.rlim_cur);
      local_30 = (undefined1  [8])*puVar1;
      limit_local._4_4_ = setrlimit(RLIMIT_NOFILE,(rlimit *)local_30);
    }
    else {
      limit_local._4_4_ = 0;
    }
  }
  return limit_local._4_4_;
}

Assistant:

int sys::raiseOpenFileLimit(llbuild_rlim_t limit) {
#if defined(_WIN32)
  int curLimit = _getmaxstdio();
  if (curLimit >= limit) {
    return 0;
  }
  // 2048 is the hard upper limit on Windows
  return _setmaxstdio(std::min(limit, 2048)) == -1 ? -1 : 0;
#else
  int ret = 0;

  struct rlimit rl;
  ret = getrlimit(RLIMIT_NOFILE, &rl);
  if (ret != 0) {
    return ret;
  }

  if (rl.rlim_cur >= limit) {
    return 0;
  }

  rl.rlim_cur = std::min(limit, rl.rlim_max);

  return setrlimit(RLIMIT_NOFILE, &rl);
#endif
}